

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O3

void QWhatsThisPrivate::say(QWidget *widget,QString *text,int x,int y)

{
  QWhatsThat *this;
  QScreen *pQVar1;
  QPoint QVar2;
  Representation RVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QWidgetData *pQVar8;
  int iVar9;
  Representation RVar10;
  int iVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((text->d).size == 0) goto LAB_003a1dce;
  this = (QWhatsThat *)operator_new(0x78);
  QWhatsThat::QWhatsThat(this,text,(QWidget *)0x0,widget);
  if (widget == (QWidget *)0x0) {
    local_40.yp.m_i = y;
    local_40.xp.m_i = x;
    pQVar1 = (QScreen *)QGuiApplication::screenAt(&local_40);
  }
  else {
    pQVar1 = QWidget::screen(widget);
  }
  if (pQVar1 == (QScreen *)0x0) {
    QGuiApplication::primaryScreen();
  }
  auVar12 = QScreen::geometry();
  pQVar8 = (this->super_QWidget).data;
  iVar4 = ((pQVar8->crect).x2.m_i - (pQVar8->crect).x1.m_i) + 1;
  iVar11 = ((pQVar8->crect).y2.m_i - (pQVar8->crect).y1.m_i) + 1;
  RVar10.m_i = auVar12._0_4_;
  if (widget == (QWidget *)0x0) {
    QVar2.xp.m_i = 0;
    QVar2.yp.m_i = 0;
    RVar3.m_i = 0;
LAB_003a1cbc:
    iVar7 = x - iVar4 / 2;
    iVar6 = auVar12._8_4_ + 1;
    if (iVar6 < iVar4 + shadowWidth + iVar7) {
      iVar7 = iVar6 - RVar10.m_i;
      if (widget != (QWidget *)0x0) {
        iVar6 = (widget->data->crect).x1.m_i;
        iVar5 = (widget->data->crect).x2.m_i;
        goto LAB_003a1ced;
      }
LAB_003a1cfa:
      iVar7 = iVar7 - iVar4;
    }
    if (RVar10.m_i < iVar7) {
      RVar10.m_i = iVar7;
    }
    if (widget != (QWidget *)0x0) {
      pQVar8 = widget->data;
      goto LAB_003a1d31;
    }
  }
  else {
    local_40.xp.m_i = 0;
    local_40.yp.m_i = 0;
    QVar2 = QWidget::mapToGlobal(widget,&local_40);
    RVar3 = QVar2.yp.m_i;
    pQVar8 = widget->data;
    iVar6 = (pQVar8->crect).x1.m_i;
    iVar5 = (pQVar8->crect).x2.m_i;
    if (iVar4 <= (iVar5 - iVar6) + 0x11) goto LAB_003a1cbc;
    iVar9 = (QVar2.xp.m_i.m_i - iVar4 / 2) + ((iVar5 - iVar6) + 1) / 2;
    iVar7 = auVar12._8_4_ + 1;
    if (iVar7 < iVar4 + shadowWidth + iVar9) {
      iVar7 = iVar7 - RVar10.m_i;
LAB_003a1ced:
      iVar6 = ((iVar5 + QVar2.xp.m_i.m_i) - iVar6) + 1;
      if (iVar6 <= iVar7) {
        iVar7 = iVar6;
      }
      goto LAB_003a1cfa;
    }
    if (RVar10.m_i < iVar9) {
      RVar10.m_i = iVar9;
    }
LAB_003a1d31:
    iVar4 = (pQVar8->crect).y2.m_i - (pQVar8->crect).y1.m_i;
    if ((iVar4 + 0x11 < iVar11) && (y = RVar3.m_i + iVar4 + 3, auVar12._12_4_ + 1 < iVar11 + y + 10)
       ) {
      y = ((RVar3.m_i + 2) - iVar11) - shadowWidth;
    }
  }
  iVar4 = auVar12._12_4_ + 1;
  local_40.yp.m_i = auVar12._4_4_;
  if (iVar4 < y + shadowWidth + iVar11 + 2) {
    iVar4 = iVar4 - local_40.yp.m_i;
    iVar6 = iVar4;
    if ((widget != (QWidget *)0x0) &&
       (iVar6 = ((RVar3.m_i + (widget->data->crect).y2.m_i) - (widget->data->crect).y1.m_i) + 1,
       iVar4 < iVar6)) {
      iVar6 = iVar4;
    }
    iVar6 = iVar6 - iVar11;
  }
  else {
    iVar6 = y + 2;
  }
  if (local_40.yp.m_i < iVar6) {
    local_40.yp.m_i = iVar6;
  }
  local_40.xp.m_i = RVar10.m_i;
  QWidget::move((QWidget *)this,&local_40);
  QWidget::show((QWidget *)this);
  QWidget::grabKeyboard((QWidget *)this);
LAB_003a1dce:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWhatsThisPrivate::say(QWidget * widget, const QString &text, int x, int y)
{
    if (text.size() == 0)
        return;
    // make a fresh widget, and set it up
    QWhatsThat *whatsThat = new QWhatsThat(text, nullptr, widget);

    // okay, now to find a suitable location
    QScreen *screen = widget ? widget->screen()
                             : QGuiApplication::screenAt(QPoint(x, y));
    if (!screen)
        screen = QGuiApplication::primaryScreen();
    QRect screenRect = screen->geometry();

    int w = whatsThat->width();
    int h = whatsThat->height();
    int sx = screenRect.x();
    int sy = screenRect.y();

    // first try locating the widget immediately above/below,
    // with nice alignment if possible.
    QPoint pos;
    if (widget)
        pos = widget->mapToGlobal(QPoint(0,0));

    if (widget && w > widget->width() + 16)
        x = pos.x() + widget->width()/2 - w/2;
    else
        x = x - w/2;

    // squeeze it in if that would result in part of what's this
    // being only partially visible
    if (x + w  + shadowWidth > sx+screenRect.width()) {
        x = (widget ? qMin(screenRect.width(), pos.x() + widget->width())
                    : screenRect.width())
            - w;
    }

    if (x < sx)
        x = sx;

    if (widget && h > widget->height() + 16) {
        y = pos.y() + widget->height() + 2; // below, two pixels spacing
        // what's this is above or below, wherever there's most space
        if (y + h + 10 > sy + screenRect.height())
            y = pos.y() + 2 - shadowWidth - h; // above, overlap
    }
    y = y + 2;

    // squeeze it in if that would result in part of what's this
    // being only partially visible
    if (y + h + shadowWidth > sy + screenRect.height()) {
        y = (widget ? qMin(screenRect.height(), pos.y() + widget->height())
                    : screenRect.height())
            - h;
    }
    if (y < sy)
        y = sy;

    whatsThat->move(x, y);
    whatsThat->show();
    whatsThat->grabKeyboard();
}